

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

DescriptorFlags __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::GetSetterFromDescriptor<true>
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          DictionaryPropertyDescriptor<unsigned_short> *descriptor,Var *setterValue,
          PropertyValueInfo *info)

{
  byte bVar1;
  PropertyAttributes PVar2;
  unsigned_short uVar3;
  Var pvVar4;
  DescriptorFlags DVar5;
  
  DVar5 = None;
  if ((descriptor->Attributes & 8) == 0) {
    uVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<true>(descriptor);
    if (uVar3 == 0xffff) {
      uVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(descriptor);
      DVar5 = None;
      if (uVar3 != 0xffff) {
        uVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(descriptor);
        pvVar4 = DynamicObject::GetSlot(instance,(uint)uVar3);
        *setterValue = pvVar4;
        uVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(descriptor);
        DVar5 = Accessor;
        if (info != (PropertyValueInfo *)0x0) {
          PVar2 = descriptor->Attributes;
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = uVar3;
          info->m_attributes = PVar2;
          info->flags = InlineCacheSetterFlag;
        }
      }
    }
    else {
      bVar1 = descriptor->Attributes;
      if ((bVar1 & 0x10) == 0) {
        if ((bVar1 & 4) == 0) {
          DVar5 = (uint)(bVar1 >> 7) * 8 + Data;
        }
        else {
          DVar5 = WritableData;
        }
      }
      else {
        DVar5 = (uint)(bVar1 >> 7) * 4 + WritableData;
      }
    }
  }
  return DVar5;
}

Assistant:

DescriptorFlags DictionaryTypeHandlerBase<T>::GetSetterFromDescriptor(DynamicObject* instance, DictionaryPropertyDescriptor<T> * descriptor, Var* setterValue, PropertyValueInfo* info)
    {
        if (descriptor->Attributes & PropertyDeleted)
        {
            return None;
        }
        if (descriptor->template GetDataPropertyIndex<allowLetConstGlobal>() != NoSlots)
        {
            // not a setter but shadows
            if (allowLetConstGlobal && (descriptor->Attributes & PropertyLetConstGlobal))
            {
                return (descriptor->Attributes & PropertyConst) ? (DescriptorFlags)(Const | Data) : WritableData;
            }
            if (descriptor->Attributes & PropertyWritable)
            {
                return WritableData;
            }
            if (descriptor->Attributes & PropertyConst)
            {
                return (DescriptorFlags)(Const | Data);
            }
            return Data;
        }
        else if (descriptor->GetSetterPropertyIndex() != NoSlots)
        {
            *setterValue = ((DynamicObject*)instance)->GetSlot(descriptor->GetSetterPropertyIndex());
            SetPropertyValueInfoNonFixed(info, instance, descriptor->GetSetterPropertyIndex(), descriptor->Attributes, InlineCacheSetterFlag);
            return Accessor;
        }
        return None;
    }